

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O3

int use_rtc_reference_structure_one_layer(AV1_COMP *cpi)

{
  AV1_PRIMARY *pAVar1;
  
  if (((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (pAVar1 = cpi->ppi, pAVar1->lap_enabled == 0)) &&
      ((cpi->oxcf).mode == '\x01')) &&
     ((((cpi->oxcf).gf_cfg.lag_in_frames == 0 && (pAVar1->number_spatial_layers == 1)) &&
      (pAVar1->number_temporal_layers == 1)))) {
    return (int)((pAVar1->rtc_ref).set_ref_frame_config == 0);
  }
  return 0;
}

Assistant:

static inline int use_rtc_reference_structure_one_layer(const AV1_COMP *cpi) {
  return is_one_pass_rt_params(cpi) && cpi->ppi->number_spatial_layers == 1 &&
         cpi->ppi->number_temporal_layers == 1 &&
         !cpi->ppi->rtc_ref.set_ref_frame_config;
}